

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzip_file_system.cpp
# Opt level: O2

void __thiscall
duckdb::MiniZStreamWrapper::Initialize(MiniZStreamWrapper *this,CompressedFile *file,bool write)

{
  unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true> *this_00;
  _Head_base<0UL,_duckdb_miniz::mz_stream_s_*,_false> _Var1;
  _Alloc_hider __p;
  int iVar2;
  pointer pFVar3;
  InternalException *pIVar4;
  undefined4 extraout_var;
  unsigned_long uVar5;
  type pFVar6;
  undefined4 extraout_var_00;
  undefined7 in_register_00000011;
  long lVar7;
  allocator local_61;
  uint8_t gzip_xlen [2];
  uint8_t gzip_hdr [10];
  
  (*(this->super_StreamWrapper)._vptr_StreamWrapper[5])();
  this->file = file;
  make_uniq<duckdb_miniz::mz_stream_s>();
  __p._M_p = (pointer)_gzip_xlen;
  _gzip_xlen = (mz_stream_s *)0x0;
  std::__uniq_ptr_impl<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>_>::
  reset((__uniq_ptr_impl<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>_>
         *)&this->mz_stream_ptr,(pointer)__p._M_p);
  std::unique_ptr<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>_>::
  ~unique_ptr((unique_ptr<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>_>
               *)gzip_xlen);
  _Var1._M_head_impl =
       (this->mz_stream_ptr).
       super_unique_ptr<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb_miniz::mz_stream_s_*,_std::default_delete<duckdb_miniz::mz_stream_s>_>
       .super__Head_base<0UL,_duckdb_miniz::mz_stream_s_*,_false>._M_head_impl;
  (_Var1._M_head_impl)->adler = 0;
  (_Var1._M_head_impl)->reserved = 0;
  (_Var1._M_head_impl)->opaque = (void *)0x0;
  *(undefined8 *)&(_Var1._M_head_impl)->data_type = 0;
  (_Var1._M_head_impl)->zalloc = (mz_alloc_func)0x0;
  (_Var1._M_head_impl)->zfree = (mz_free_func)0x0;
  (_Var1._M_head_impl)->msg = (char *)0x0;
  (_Var1._M_head_impl)->state = (mz_internal_state *)0x0;
  *(undefined8 *)&(_Var1._M_head_impl)->avail_out = 0;
  (_Var1._M_head_impl)->total_out = 0;
  (_Var1._M_head_impl)->total_in = 0;
  (_Var1._M_head_impl)->next_out = (uchar *)0x0;
  (_Var1._M_head_impl)->next_in = (uchar *)0x0;
  *(undefined8 *)&(_Var1._M_head_impl)->avail_in = 0;
  this->writing = write;
  if ((int)CONCAT71(in_register_00000011,write) == 0) {
    this_00 = &file->child_handle;
    pFVar3 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::
             operator->(this_00);
    lVar7 = 10;
    iVar2 = (*pFVar3->file_system->_vptr_FileSystem[5])(pFVar3->file_system,pFVar3,gzip_hdr,10);
    uVar5 = NumericCastImpl<unsigned_long,_long,_false>::Convert(CONCAT44(extraout_var,iVar2));
    GZipFileSystem::VerifyGZIPHeader
              (gzip_hdr,uVar5,(optional_ptr<duckdb::CompressedFile,_true>)file);
    if ((gzip_hdr._3_4_ & 4) != 0) {
      pFVar3 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::
               operator->(this_00);
      (*pFVar3->file_system->_vptr_FileSystem[0x20])(pFVar3->file_system,pFVar3,10);
      pFVar3 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::
               operator->(this_00);
      (*pFVar3->file_system->_vptr_FileSystem[5])(pFVar3->file_system,pFVar3,gzip_xlen,2);
      uVar5 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)(ushort)gzip_xlen);
      lVar7 = uVar5 + 0xc;
    }
    if ((gzip_hdr[3] & 8) != 0) {
      pFVar3 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::
               operator->(this_00);
      (*pFVar3->file_system->_vptr_FileSystem[0x20])(pFVar3->file_system,pFVar3,lVar7);
      pFVar6 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::
               operator*(this_00);
      do {
        iVar2 = (*pFVar6->file_system->_vptr_FileSystem[5])(pFVar6->file_system,pFVar6,gzip_xlen,1);
        lVar7 = lVar7 + 1;
        if (CONCAT44(extraout_var_00,iVar2) != 1) break;
      } while (gzip_xlen[0] != '\0');
    }
    pFVar3 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::
             operator->(this_00);
    (*pFVar3->file_system->_vptr_FileSystem[0x20])(pFVar3->file_system,pFVar3,lVar7);
    iVar2 = duckdb_miniz::mz_inflateInit2
                      ((this->mz_stream_ptr).
                       super_unique_ptr<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>_>
                       ._M_t.
                       super___uniq_ptr_impl<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_duckdb_miniz::mz_stream_s_*,_std::default_delete<duckdb_miniz::mz_stream_s>_>
                       .super__Head_base<0UL,_duckdb_miniz::mz_stream_s_*,_false>._M_head_impl,-0xf)
    ;
    if (iVar2 != 0) {
      pIVar4 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string((string *)gzip_xlen,"Failed to initialize miniz",&local_61);
      InternalException::InternalException(pIVar4,(string *)gzip_xlen);
      __cxa_throw(pIVar4,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  else {
    this->crc = 0;
    this->total_size = 0;
    gzip_hdr[0] = '\x1f';
    gzip_hdr[1] = 0x8b;
    gzip_hdr[2] = '\b';
    gzip_hdr[3] = '\0';
    gzip_hdr[4] = '\0';
    gzip_hdr[5] = '\0';
    gzip_hdr[6] = '\0';
    gzip_hdr[7] = '\0';
    gzip_hdr[8] = '\0';
    gzip_hdr[9] = 0xff;
    pFVar3 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::
             operator->(&file->child_handle);
    (*pFVar3->file_system->_vptr_FileSystem[6])(pFVar3->file_system,pFVar3,gzip_hdr,10);
    iVar2 = duckdb_miniz::mz_deflateInit2
                      ((this->mz_stream_ptr).
                       super_unique_ptr<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>_>
                       ._M_t.
                       super___uniq_ptr_impl<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_duckdb_miniz::mz_stream_s_*,_std::default_delete<duckdb_miniz::mz_stream_s>_>
                       .super__Head_base<0UL,_duckdb_miniz::mz_stream_s_*,_false>._M_head_impl,6,8,
                       -0xf,1,0);
    if (iVar2 != 0) {
      pIVar4 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string((string *)gzip_xlen,"Failed to initialize miniz",&local_61);
      InternalException::InternalException(pIVar4,(string *)gzip_xlen);
      __cxa_throw(pIVar4,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  return;
}

Assistant:

void MiniZStreamWrapper::Initialize(CompressedFile &file, bool write) {
	Close();
	this->file = &file;
	mz_stream_ptr = make_uniq<duckdb_miniz::mz_stream>();
	memset(mz_stream_ptr.get(), 0, sizeof(duckdb_miniz::mz_stream));
	this->writing = write;

	// TODO use custom alloc/free methods in miniz to throw exceptions on OOM
	uint8_t gzip_hdr[GZIP_HEADER_MINSIZE];
	if (write) {
		crc = MZ_CRC32_INIT;
		total_size = 0;

		MiniZStream::InitializeGZIPHeader(gzip_hdr);
		file.child_handle->Write(gzip_hdr, GZIP_HEADER_MINSIZE);

		auto ret = mz_deflateInit2(mz_stream_ptr.get(), duckdb_miniz::MZ_DEFAULT_LEVEL, MZ_DEFLATED,
		                           -MZ_DEFAULT_WINDOW_BITS, 1, 0);
		if (ret != duckdb_miniz::MZ_OK) {
			throw InternalException("Failed to initialize miniz");
		}
	} else {
		idx_t data_start = GZIP_HEADER_MINSIZE;
		auto read_count = file.child_handle->Read(gzip_hdr, GZIP_HEADER_MINSIZE);
		GZipFileSystem::VerifyGZIPHeader(gzip_hdr, NumericCast<idx_t>(read_count), &file);
		// Skip over the extra field if necessary
		if (gzip_hdr[3] & GZIP_FLAG_EXTRA) {
			uint8_t gzip_xlen[2];
			file.child_handle->Seek(data_start);
			file.child_handle->Read(gzip_xlen, 2);
			auto xlen = NumericCast<idx_t>((uint8_t)gzip_xlen[0] | (uint8_t)gzip_xlen[1] << 8);
			data_start += xlen + 2;
		}
		// Skip over the file name if necessary
		if (gzip_hdr[3] & GZIP_FLAG_NAME) {
			file.child_handle->Seek(data_start);
			data_start += GZipConsumeString(*file.child_handle);
		}
		file.child_handle->Seek(data_start);
		// stream is now set to beginning of payload data
		auto ret = duckdb_miniz::mz_inflateInit2(mz_stream_ptr.get(), -MZ_DEFAULT_WINDOW_BITS);
		if (ret != duckdb_miniz::MZ_OK) {
			throw InternalException("Failed to initialize miniz");
		}
	}
}